

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O1

bool __thiscall Jinx::Impl::Parser::Execute(Parser *this)

{
  BytecodeHeader header;
  undefined8 local_1c;
  undefined4 local_14;
  
  Buffer::Reserve((this->m_bytecode).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr,0x400);
  local_1c = 0x1584e494a;
  local_14 = 0;
  Buffer::Write((this->m_writer).m_buffer.
                super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                &(this->m_writer).m_pos,&local_1c,0xc);
  BinaryWriter::Write(&this->m_writer,(this->m_name)._M_dataplus._M_p);
  ParseScript(this);
  return (bool)(this->m_error ^ 1);
}

Assistant:

inline_t bool Parser::Execute()
	{
		// Reserve 1K space
		m_bytecode->Reserve(1024);

		// Write bytecode header
		BytecodeHeader header;
		m_writer.Write(&header, sizeof(header));

		// Write script name
		m_writer.Write(m_name.c_str());

		// Parse script symbols into bytecode
		ParseScript();

		// Return error status
		return !m_error;
	}